

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O0

char * __thiscall llama_vocab::token_get_text(llama_vocab *this,llama_token id)

{
  pointer piVar1;
  char *pcVar2;
  undefined4 in_ESI;
  size_type in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  piVar1 = std::unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>::operator->
                     ((unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_> *)
                      0x53c56b);
  if (piVar1->type == LLAMA_VOCAB_TYPE_NONE) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,0xb38,"GGML_ASSERT(%s) failed","pimpl->type != LLAMA_VOCAB_TYPE_NONE");
  }
  std::unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>::operator->
            ((unique_ptr<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_> *)0x53c59b);
  std::vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_>::at
            ((vector<llama_vocab::token_data,_std::allocator<llama_vocab::token_data>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  pcVar2 = (char *)::std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char * llama_vocab::token_get_text(llama_token id) const {
    GGML_ASSERT(pimpl->type != LLAMA_VOCAB_TYPE_NONE);
    return pimpl->id_to_token.at(id).text.c_str();
}